

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O1

int Abc_NodeIsOr2(Abc_Obj_t *pNode)

{
  char *__s1;
  int iVar1;
  uint uVar2;
  
  if (pNode->pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                  ,0x3a2,"int Abc_NodeIsOr2(Abc_Obj_t *)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
    uVar2 = 0;
    if ((pNode->vFanins).nSize == 2) {
      if (pNode->pNtk->ntkFunc != ABC_FUNC_SOP) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                      ,0x3ac,"int Abc_NodeIsOr2(Abc_Obj_t *)");
      }
      iVar1 = Abc_SopIsOrType((char *)(pNode->field_5).pData);
      uVar2 = 1;
      if (iVar1 == 0) {
        __s1 = (char *)(pNode->field_5).pData;
        iVar1 = strcmp(__s1,"01 0\n");
        if (iVar1 != 0) {
          iVar1 = strcmp(__s1,"10 0\n");
          if (iVar1 != 0) {
            iVar1 = strcmp(__s1,"00 0\n");
            uVar2 = (uint)(iVar1 == 0);
          }
        }
      }
    }
    return uVar2;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                ,0x3a3,"int Abc_NodeIsOr2(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeIsOr2( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_ObjIsNode(pNode) ); 
    if ( Abc_ObjFaninNum(pNode) != 2 )
        return 0;
    if ( Abc_NtkHasSop(pNtk) )
    return ( Abc_SopIsOrType(((char *)pNode->pData))   || 
         !strcmp(((char *)pNode->pData), "01 0\n") ||
         !strcmp(((char *)pNode->pData), "10 0\n") ||
         !strcmp(((char *)pNode->pData), "00 0\n") );
         //off-sets, too
    assert( 0 );
    return 0;
}